

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::copy_cut_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,Allocator *allocator,
               int num_threads)

{
  int iVar1;
  int _w;
  int _c;
  Mat cutm;
  Mat local_a0;
  Mat local_68;
  
  if (right + left == 0 && bottom + top == 0) {
    Mat::operator=(dst,src);
    return;
  }
  _w = src->w - (right + left);
  iVar1 = src->h - (bottom + top);
  if (src->dims == 3) {
    _c = src->c;
    Mat::create(dst,_w,iVar1,_c,src->elemsize,allocator);
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      iVar1 = 0;
      if (_c < 1) {
        _c = 0;
      }
      for (; _c != iVar1; iVar1 = iVar1 + 1) {
        Mat::channel(&local_a0,src,iVar1);
        Mat::channel(&local_68,dst,iVar1);
        copy_cut_border_image(&local_a0,&local_68,top,left);
        Mat::~Mat(&local_68);
        Mat::~Mat(&local_a0);
      }
    }
  }
  else if (src->dims == 2) {
    Mat::create(dst,_w,iVar1,src->elemsize,allocator);
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      copy_cut_border_image(src,dst,top,left);
      return;
    }
  }
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, Allocator* allocator, int num_threads)
{
    int w = src.w - left - right;
    int h = src.h - top - bottom;
    size_t elemsize = src.elemsize;

    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h, elemsize, allocator);
        if (dst.empty())
            return;

        copy_cut_border_image(src, dst, top, left);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels, elemsize, allocator);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for num_threads(num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat cutm = dst.channel(q);

            copy_cut_border_image(m, cutm, top, left);
        }
    }
}